

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O1

bool __thiscall
cmCMakePolicyCommand::HandleSetMode
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  _func_int **pp_Var1;
  pointer pbVar2;
  cmMakefile *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  cmState *this_01;
  char *pcVar7;
  PolicyStatus status;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 == 0x60) {
    iVar4 = std::__cxx11::string::compare((char *)(pbVar2 + 2));
    if (iVar4 == 0) {
      status = OLD;
    }
    else {
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 2));
      if (iVar5 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_198,"SET given unrecognized policy status \"",0x26);
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_198,pbVar2[2]._M_dataplus._M_p,
                            pbVar2[2]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
        std::ios_base::~ios_base(local_128);
        return false;
      }
      status = NEW;
    }
    bVar3 = cmMakefile::SetPolicy
                      ((this->super_cmCommand).Makefile,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,status);
    if (bVar3) {
      iVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1));
      if (iVar5 != 0 || iVar4 != 0) {
        return true;
      }
      this_01 = cmMakefile::GetState((this->super_cmCommand).Makefile);
      pp_Var1 = (_func_int **)(local_198 + 0x10);
      local_198._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,"CMAKE_BACKWARDS_COMPATIBILITY","");
      pcVar7 = cmState::GetInitializedCacheValue(this_01,(string *)local_198);
      if ((_func_int **)local_198._0_8_ != pp_Var1) {
        operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
      }
      if (pcVar7 == (char *)0x0) {
        this_00 = (this->super_cmCommand).Makefile;
        local_198._0_8_ = pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_198,"CMAKE_BACKWARDS_COMPATIBILITY","");
        cmMakefile::AddCacheDefinition
                  (this_00,(string *)local_198,"2.4",
                   "For backwards compatibility, what version of CMake commands and syntax should this version of CMake try to support."
                   ,STRING,false);
        if ((_func_int **)local_198._0_8_ != pp_Var1) {
          operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
          return true;
        }
        return true;
      }
      return true;
    }
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"SET failed to set policy.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_198);
  }
  else {
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"SET must be given exactly 2 additional arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_198);
  }
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmCMakePolicyCommand::HandleSetMode(std::vector<std::string> const& args)
{
  if (args.size() != 3) {
    this->SetError("SET must be given exactly 2 additional arguments.");
    return false;
  }

  cmPolicies::PolicyStatus status;
  if (args[2] == "OLD") {
    status = cmPolicies::OLD;
  } else if (args[2] == "NEW") {
    status = cmPolicies::NEW;
  } else {
    std::ostringstream e;
    e << "SET given unrecognized policy status \"" << args[2] << "\"";
    this->SetError(e.str());
    return false;
  }

  if (!this->Makefile->SetPolicy(args[1].c_str(), status)) {
    this->SetError("SET failed to set policy.");
    return false;
  }
  if (args[1] == "CMP0001" &&
      (status == cmPolicies::WARN || status == cmPolicies::OLD)) {
    if (!(this->Makefile->GetState()->GetInitializedCacheValue(
          "CMAKE_BACKWARDS_COMPATIBILITY"))) {
      // Set it to 2.4 because that is the last version where the
      // variable had meaning.
      this->Makefile->AddCacheDefinition(
        "CMAKE_BACKWARDS_COMPATIBILITY", "2.4",
        "For backwards compatibility, what version of CMake "
        "commands and "
        "syntax should this version of CMake try to support.",
        cmStateEnums::STRING);
    }
  }
  return true;
}